

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  demo1();
  demo2();
  demo3();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\t --- IMLE demo (no templates) ended! ---",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    demo1();
    demo2();
    demo3();

    cout << "\n\t --- IMLE demo (no templates) ended! ---" << endl;
    return 0;
}